

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

bool __thiscall
Rml::Context::ProcessMouseButtonUp(Context *this,int button_index,int key_modifier_state)

{
  Element *pEVar1;
  pointer ppEVar2;
  int key_modifier_state_00;
  bool bVar3;
  bool bVar4;
  Element *pEVar5;
  pointer ppEVar6;
  Context *pCVar7;
  allocator<char> local_7d;
  int local_7c;
  Dictionary drag_parameters;
  Dictionary parameters;
  
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar7 = this;
  GenerateMouseEventParameters(this,&parameters,button_index);
  GenerateKeyModifierEventParameters(pCVar7,&parameters,key_modifier_state);
  bVar3 = IsMouseInteracting(this);
  pEVar1 = this->hover;
  if (button_index == 0) {
    if (pEVar1 != (Element *)0x0) {
      Element::DispatchEvent(pEVar1,Mouseup,&parameters);
      if ((this->hover != (Element *)0x0) && (pEVar1 = this->active, pEVar1 != (Element *)0x0)) {
        pEVar5 = FindFocusElement(this->hover);
        if (pEVar1 == pEVar5) {
          Element::DispatchEvent(this->active,Click,&parameters);
        }
      }
    }
    ppEVar2 = (this->active_chain).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_7c = key_modifier_state;
    for (ppEVar6 = (this->active_chain).
                   super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                   super__Vector_impl_data._M_start; key_modifier_state_00 = local_7c,
        ppEVar6 != ppEVar2; ppEVar6 = ppEVar6 + 1) {
      pEVar1 = *ppEVar6;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&drag_parameters,"active",&local_7d);
      Element::SetPseudoClass(pEVar1,(String *)&drag_parameters,false);
      ::std::__cxx11::string::~string((string *)&drag_parameters);
    }
    ppEVar6 = (this->active_chain).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppEVar6) {
      (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppEVar6;
    }
    this->active = (Element *)0x0;
    if (this->drag != (Element *)0x0) {
      if (this->drag_started == true) {
        drag_parameters.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        drag_parameters.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        drag_parameters.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GenerateMouseEventParameters(this,&drag_parameters,-1);
        pCVar7 = this;
        GenerateDragEventParameters(this,&drag_parameters);
        GenerateKeyModifierEventParameters(pCVar7,&drag_parameters,key_modifier_state_00);
        if ((this->drag_hover != (Element *)0x0) && (this->drag_verbose == true)) {
          Element::DispatchEvent(this->drag_hover,Dragdrop,&drag_parameters);
          if (this->drag_hover != (Element *)0x0) {
            Element::DispatchEvent(this->drag_hover,Dragout,&drag_parameters);
          }
        }
        if (this->drag != (Element *)0x0) {
          Element::DispatchEvent(this->drag,Dragend,&drag_parameters);
        }
        ReleaseDragClone(this);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector(&drag_parameters.m_container);
      }
      this->drag = (Element *)0x0;
      this->drag_hover = (Element *)0x0;
      ppEVar6 = (this->drag_hover_chain).m_container.
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->drag_hover_chain).m_container.
          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar6) {
        (this->drag_hover_chain).m_container.
        super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar6;
      }
      ProcessMouseMove(this,(this->mouse_position).x,(this->mouse_position).y,key_modifier_state_00)
      ;
    }
  }
  else if (pEVar1 != (Element *)0x0) {
    Element::DispatchEvent(pEVar1,Mouseup,&parameters);
  }
  bVar4 = ScrollController::HasAutoscrollMoved
                    ((this->scroll_controller)._M_t.
                     super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
                     .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl);
  if (bVar4) {
    ScrollController::Reset
              ((this->scroll_controller)._M_t.
               super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
               .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&parameters.m_container);
  return !bVar3;
}

Assistant:

bool Context::ProcessMouseButtonUp(int button_index, int key_modifier_state)
{
	Dictionary parameters;
	GenerateMouseEventParameters(parameters, button_index);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	// We want to return the interaction state before handling the mouse up events, so that any active element that is released is considered to
	// capture the event.
	const bool result = !IsMouseInteracting();

	// Process primary click.
	if (button_index == 0)
	{
		// The elements in the new hover chain have the 'onmouseup' event called on them.
		if (hover)
			hover->DispatchEvent(EventId::Mouseup, parameters);

		// If the active element (the one that was being hovered over when the mouse button was pressed) is still being
		// hovered over, we click it.
		if (hover && active && active == FindFocusElement(hover))
		{
			active->DispatchEvent(EventId::Click, parameters);
		}

		// Unset the 'active' pseudo-class on all the elements in the active chain; because they may not necessarily
		// have had 'onmouseup' called on them, we can't guarantee this has happened already.
		for (Element* element : active_chain)
			element->SetPseudoClass("active", false);
		active_chain.clear();
		active = nullptr;

		if (drag)
		{
			if (drag_started)
			{
				Dictionary drag_parameters;
				GenerateMouseEventParameters(drag_parameters);
				GenerateDragEventParameters(drag_parameters);
				GenerateKeyModifierEventParameters(drag_parameters, key_modifier_state);

				if (drag_hover)
				{
					if (drag_verbose)
					{
						drag_hover->DispatchEvent(EventId::Dragdrop, drag_parameters);
						// User may have removed the element, do an extra check.
						if (drag_hover)
							drag_hover->DispatchEvent(EventId::Dragout, drag_parameters);
					}
				}

				if (drag)
					drag->DispatchEvent(EventId::Dragend, drag_parameters);

				ReleaseDragClone();
			}

			drag = nullptr;
			drag_hover = nullptr;
			drag_hover_chain.clear();

			// We may have changes under our mouse, this ensures that the hover chain is properly updated
			ProcessMouseMove(mouse_position.x, mouse_position.y, key_modifier_state);
		}
	}
	else
	{
		// Not the left mouse button, so we're not doing any special processing.
		if (hover)
			hover->DispatchEvent(EventId::Mouseup, parameters);
	}

	// If we have autoscrolled while holding the middle mouse button, release the autoscroll mode now.
	if (scroll_controller->HasAutoscrollMoved())
		scroll_controller->Reset();

	return result;
}